

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O1

type __thiscall
chrono::ChFunctorArchiveInSpecific<chrono::ChVector<double>>::_archive_in<chrono::ChVector<double>>
          (ChFunctorArchiveInSpecific<chrono::ChVector<double>> *this,ChArchiveIn *marchive)

{
  long lVar1;
  char *local_38;
  long local_30;
  undefined1 local_28;
  
  lVar1 = *(long *)(this + 8);
  ChArchiveIn::VersionRead<chrono::ChVector<double>>(marchive);
  local_38 = "x";
  local_28 = 0;
  local_30 = lVar1;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = lVar1 + 8;
  local_38 = "y";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = lVar1 + 0x10;
  local_38 = "z";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  return;
}

Assistant:

typename enable_if< ChDetect_ArchiveIN<Tc>::value, void >::type
        _archive_in(ChArchiveIn& marchive) {
            this->pt2Object->ArchiveIN(marchive);
        }